

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O2

void hyperplane_dimension_order(double *angle_values,int *dims,int ndims,int *dimension_order)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int *__i;
  int *__last;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp_01;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp_02;
  int *local_40;
  double *local_38;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < ndims) {
    uVar2 = (ulong)(uint)ndims;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dimension_order[uVar1] = (int)uVar1;
  }
  if (ndims != 0) {
    uVar1 = (ulong)ndims;
    lVar3 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    __comp._M_comp.dims = &local_40;
    __comp._M_comp.angle_values = &local_38;
    local_40 = dims;
    local_38 = angle_values;
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
              (dimension_order,dimension_order + uVar1,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               __comp);
    if (ndims < 0x11) {
      __comp_01._M_comp.dims = &local_40;
      __comp_01._M_comp.angle_values = &local_38;
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
                (dimension_order,dimension_order + uVar1,__comp_01);
    }
    else {
      __last = dimension_order + 0x10;
      __comp_00._M_comp.dims = &local_40;
      __comp_00._M_comp.angle_values = &local_38;
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
                (dimension_order,__last,__comp_00);
      for (lVar3 = uVar1 * 4 + -0x40; lVar3 != 0; lVar3 = lVar3 + -4) {
        __comp_02._M_comp.dims = &local_40;
        __comp_02._M_comp.angle_values = &local_38;
        std::
        __unguarded_linear_insert<int*,__gnu_cxx::__ops::_Val_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
                  (__last,__comp_02);
        __last = __last + 1;
      }
    }
  }
  return;
}

Assistant:

void hyperplane_dimension_order(const double angle_values[],
				const int dims[],
				const int ndims,
				int dimension_order[]) {
  //O(n)
  for (int i = 0; i < ndims; i++) {
	dimension_order[i] = i;
  }

  // O ( ndims log (ndims) )
  //Sort the dimension_order vector based on the values in angle_values
  std::sort(&dimension_order[0], &dimension_order[0] + ndims,
			[&](const int &j, const int &k) {
			  if (angle_values[j] == angle_values[k])
				return dims[j] > dims[k];
			  else
				return angle_values[j] < angle_values[k];
			}
  );
}